

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_BtFindBestMatch_selectMLS(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  uint mls;
  uint uVar1;
  BYTE *pBVar2;
  size_t sVar3;
  BYTE *iend;
  
  uVar1 = (ms->cParams).minMatch;
  mls = uVar1 - 6;
  if (mls < 2) {
    pBVar2 = (ms->window).base + ms->nextToUpdate;
    iend = (BYTE *)0x6;
  }
  else if (uVar1 == 5) {
    pBVar2 = (ms->window).base + ms->nextToUpdate;
    iend = (BYTE *)0x5;
  }
  else {
    pBVar2 = (ms->window).base + ms->nextToUpdate;
    iend = (BYTE *)0x4;
  }
  if (ip < pBVar2) {
    return 0;
  }
  ZSTD_updateDUBT(ms,ip,iend,mls);
  sVar3 = ZSTD_DUBT_findBestMatch(ms,ip,iLimit,offsetPtr,(U32)iend,ZSTD_noDict);
  return sVar3;
}

Assistant:

static size_t
ZSTD_BtFindBestMatch_selectMLS (  ZSTD_matchState_t* ms,
                            const BYTE* ip, const BYTE* const iLimit,
                                  size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_BtFindBestMatch(ms, ip, iLimit, offsetPtr, 4, ZSTD_noDict);
    case 5 : return ZSTD_BtFindBestMatch(ms, ip, iLimit, offsetPtr, 5, ZSTD_noDict);
    case 7 :
    case 6 : return ZSTD_BtFindBestMatch(ms, ip, iLimit, offsetPtr, 6, ZSTD_noDict);
    }
}